

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O2

void nh_ws_parse(ws_context_t *ctx)

{
  uint32_t *puVar1;
  byte bVar2;
  nh_ws_parse_state nVar3;
  uint64_t uVar4;
  byte *pbVar5;
  char *pcVar6;
  size_t len;
  char *__dest;
  uint32_t uVar7;
  uint64_t uVar8;
  size_t __n;
  uint uVar9;
  
  uVar9 = (ctx->stream).length;
  if (5 < uVar9) {
    nVar3 = ctx->parse_state;
    if (nVar3 == PARSE_WS_HEAD) {
      pbVar5 = (byte *)(ctx->stream).buf;
      (ctx->frame).fin = *pbVar5 >> 7;
      (ctx->frame).opcode = *pbVar5 & 0xf;
      (ctx->stream).index = 1;
      (ctx->frame).mask = pbVar5[1] >> 7;
      bVar2 = pbVar5[1];
      uVar8 = (uint64_t)(bVar2 & 0x7f);
      (ctx->frame).payload_length = uVar8;
      (ctx->stream).index = 2;
      if (uVar8 == 0x7f) {
        (ctx->frame).payload_length = *(uint64_t *)(pbVar5 + 2);
        nh_reverse_endian((char *)&(ctx->frame).payload_length,8);
        uVar9 = (ctx->stream).index + 8;
        (ctx->stream).index = uVar9;
        pbVar5 = (byte *)(ctx->stream).buf;
        uVar8 = (ctx->frame).payload_length;
      }
      else if ((bVar2 & 0x7f) == 0x7e) {
        uVar8 = (uint64_t)(ushort)(*(ushort *)(pbVar5 + 2) << 8 | *(ushort *)(pbVar5 + 2) >> 8);
        (ctx->frame).payload_length = uVar8;
        (ctx->stream).index = 4;
        uVar9 = 4;
      }
      else {
        uVar9 = 2;
      }
      *(undefined4 *)(ctx->frame).masking_key = *(undefined4 *)(pbVar5 + uVar9);
      uVar7 = uVar9 + 4;
      (ctx->stream).index = uVar7;
      if (uVar8 == 0) {
        ctx->parse_state = PARSE_WS_DONE;
        return;
      }
      pcVar6 = (char *)malloc(uVar8 + 1);
      (ctx->frame).payload = pcVar6;
      pcVar6[uVar8] = '\0';
      ctx->parse_state = PARSE_WS_PAYLOAD;
      uVar9 = (ctx->stream).length;
    }
    else {
      if (nVar3 != PARSE_WS_PAYLOAD) {
        if (nVar3 != PARSE_WS_DONE) {
          return;
        }
        len = (ctx->frame).payload_length;
        goto LAB_00106d0c;
      }
      uVar8 = (ctx->frame).payload_length;
      uVar7 = (ctx->stream).index;
    }
    uVar4 = (ctx->frame).payload_consumed_length;
    __n = uVar8 - uVar4;
    uVar9 = uVar9 - uVar7;
    __dest = (ctx->frame).payload + uVar4;
    pcVar6 = (ctx->stream).buf + uVar7;
    if (__n <= uVar9) {
      memcpy(__dest,pcVar6,__n);
      len = (ctx->frame).payload_length;
      (ctx->frame).payload_consumed_length = len;
      puVar1 = &(ctx->stream).index;
      *puVar1 = *puVar1 + (int)__n;
      ctx->parse_state = PARSE_WS_DONE;
LAB_00106d0c:
      nh_umask((uchar *)(ctx->frame).payload,len,(ctx->frame).masking_key);
      nh_stream_free(&ctx->stream);
      return;
    }
    memcpy(__dest,pcVar6,(ulong)uVar9);
    (ctx->frame).payload_consumed_length = (ctx->frame).payload_length;
    puVar1 = &(ctx->stream).index;
    *puVar1 = *puVar1 + uVar9;
  }
  return;
}

Assistant:

void nh_ws_parse(ws_context_t *ctx) {
    /**
      0                   1                   2                   3
      0 1 2 3 4 5 6 7 8 9 0 1 2 3 4 5 6 7 8 9 0 1 2 3 4 5 6 7 8 9 0 1
     +-+-+-+-+-------+-+-------------+-------------------------------+
     |F|R|R|R| opcode|M| Payload     |    Extended payload length    |
     |I|S|S|S|  (4)  |A|     (7)     |             (16/64)           |
     |N|V|V|V|       |S|             |   (if payload len==126/127)   |
     | |1|2|3|       |K|             |                               |
     +-+-+-+-+-------+-+-------------+ - - - - - - - - - - - - - - - +
     |     Extended payload length continued, if payload len == 127  |
     + - - - - - - - - - - - - - - - +-------------------------------+
     |                               |Masking-key, if MASK set to 1  |
     +-------------------------------+-------------------------------+
     | Masking-key (continued)       |          Payload Data         |
     +-------------------------------- - - - - - - - - - - - - - - - +
     :                     Payload Data continued ...                :
     + - - - - - - - - - - - - - - - - - - - - - - - - - - - - - - - +
     |                     Payload Data continued ...                |
     +---------------------------------------------------------------+
     **/

    nh_stream_t *stream = &ctx->stream;
    // return if not complete
    if (stream->length < 6) return;

    nh_ws_frame *frame = &ctx->frame;
    uint64_t need_len, remain_len;
    switch (ctx->parse_state) {
        case PARSE_WS_HEAD:
            frame->fin = (stream->buf[0] & 0x80) == 0x80;
            // skip parse RSV1~3
            frame->opcode = stream->buf[0] & 0x0F;
            stream->index = 1;
            frame->mask = (stream->buf[1] & 0x80) == 0X80;
            frame->payload_length = stream->buf[1] & 0x7F;
            stream->index = 2;
            if (frame->payload_length == 126) {
                frame->payload_length = (stream->buf[stream->index] & 0xFF) << 8 |
                                        (stream->buf[stream->index + 1] & 0xFF);
                stream->index += 2;
            } else if (frame->payload_length == 127) {
                memcpy(&(frame->payload_length), &stream->buf[stream->index], 8);
                nh_reverse_endian((char *) &frame->payload_length, 8);
                stream->index += 8;
            }
            memcpy(&(frame->masking_key), &stream->buf[stream->index], 4);
            stream->index += 4;

            if (!frame->payload_length) {
                ctx->parse_state = PARSE_WS_DONE;
                return;
            }
            // prepare payload
            frame->payload = malloc(sizeof(char) * frame->payload_length + 1);
            frame->payload[frame->payload_length] = '\0';
            ctx->parse_state = PARSE_WS_PAYLOAD;
            // fallthrough
        case PARSE_WS_PAYLOAD:
            need_len = frame->payload_length - frame->payload_consumed_length;
            remain_len = stream->length - stream->index;
            if (remain_len < need_len) {
                memcpy(&frame->payload[frame->payload_consumed_length],
                       &stream->buf[stream->index],
                       remain_len);
                frame->payload_consumed_length = frame->payload_length;
                stream->index += remain_len;
                return;
            }
            memcpy(&frame->payload[frame->payload_consumed_length],
                   &stream->buf[stream->index],
                   need_len);
            frame->payload_consumed_length = frame->payload_length;
            stream->index += need_len;
            ctx->parse_state = PARSE_WS_DONE;
            // fallthrough
        case PARSE_WS_DONE:
            nh_umask((unsigned char *) frame->payload, frame->payload_length, frame->masking_key);
            nh_stream_free(&ctx->stream);
            break;
    }
}